

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

_Bool upb_Message_SetExtensionString
                (upb_Message *msg,upb_MiniTableExtension *e,upb_StringView value,upb_Arena *a)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_FieldRep uVar3;
  upb_Arena *a_local;
  upb_MiniTableExtension *e_local;
  upb_Message *msg_local;
  upb_StringView value_local;
  
  value_local.data = (char *)value.size;
  msg_local = (upb_Message *)value.data;
  uVar2 = upb_MiniTableExtension_CType(e);
  if (uVar2 != kUpb_CType_String) {
    uVar2 = upb_MiniTableExtension_CType(e);
    if (uVar2 != kUpb_CType_Bytes) {
      __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_String || upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x2e5,
                    "_Bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
                   );
    }
  }
  uVar3 = _upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e);
  if (uVar3 == kUpb_FieldRep_StringView) {
    _Var1 = upb_Message_SetExtension(msg,e,&msg_local,a);
    return _Var1;
  }
  __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_StringView"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x2e7,
                "_Bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionString(
    struct upb_Message* msg, const upb_MiniTableExtension* e,
    upb_StringView value, upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_String ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_StringView);
  return upb_Message_SetExtension(msg, e, &value, a);
}